

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *psVar3;
  Expr *pEVar4;
  Select *pSVar5;
  Select *pSVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Expr *pEVar10;
  ExprList_item *pEVar11;
  long lVar12;
  Expr *pE;
  Expr *pEVar13;
  ulong uVar14;
  int iVar15;
  ExprList *pEVar16;
  ulong uVar17;
  ExprList_item *pEVar18;
  Expr *p;
  int iCol;
  int local_ac;
  Expr *local_a8;
  sqlite3 *local_a0;
  int local_94;
  anon_union_8_3_1bb8468b_for_uNC local_90;
  ExprList *local_88;
  Parse *local_80;
  Parse *local_78;
  ExprList_item *local_70;
  NameContext local_68;
  
  pEVar16 = pSelect->pOrderBy;
  if (pEVar16 == (ExprList *)0x0) {
    return 0;
  }
  local_a0 = pParse->db;
  uVar9 = pEVar16->nExpr;
  uVar17 = (ulong)uVar9;
  if (local_a0->aLimit[2] < (int)uVar9) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < (int)uVar9) {
      lVar12 = 0;
      do {
        pbVar1 = &pEVar16->a[0].field_0x19 + lVar12;
        *pbVar1 = *pbVar1 & 0xfe;
        lVar12 = lVar12 + 0x20;
      } while (uVar17 << 5 != lVar12);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar6 = pSelect->pPrior;
    while (pSVar5 = pSVar6, pSVar5 != (Select *)0x0) {
      pSVar5->pNext = pSelect;
      pSelect = pSVar5;
      pSVar6 = pSVar5->pPrior;
    }
    local_70 = pEVar16->a;
    local_88 = pEVar16;
    local_78 = pParse;
    do {
      if ((int)uVar17 < 1) {
        return 0;
      }
      local_80 = (Parse *)pSelect->pEList;
      iVar15 = 0;
      local_94 = 0;
      pEVar18 = local_70;
      do {
        local_ac = -1;
        if ((pEVar18->field_0x19 & 1) == 0) {
          p = pEVar18->pExpr;
          while (p != (Expr *)0x0) {
            if ((p->flags >> 0xc & 1) == 0) goto LAB_0016dd04;
            if ((p->flags >> 0x12 & 1) == 0) {
              pEVar11 = (ExprList_item *)&p->pLeft;
            }
            else {
              pEVar11 = ((p->x).pList)->a;
            }
            p = pEVar11->pExpr;
          }
          p = (Expr *)0x0;
LAB_0016dd04:
          iVar7 = sqlite3ExprIsInteger(p,&local_ac);
          if (iVar7 == 0) {
            local_ac = resolveAsName(local_80,(ExprList *)p,pE);
            psVar3 = local_a0;
            if (local_ac == 0) {
              if (p == (Expr *)0x0) {
                pEVar10 = (Expr *)0x0;
              }
              else {
                pEVar10 = exprDup(local_a0,p,0,(u8 **)0x0);
              }
              iVar7 = local_ac;
              if (psVar3->mallocFailed == '\0') {
                local_90.pEList = pSelect->pEList;
                local_68.pSrcList = pSelect->pSrc;
                local_68.pWinSelect = (Select *)0x0;
                local_68.pNext = (NameContext *)0x0;
                local_68.nRef = 0;
                local_68.nErr = 0;
                local_68.ncFlags = 0x81;
                local_68._42_6_ = 0;
                psVar3 = pParse->db;
                uVar2 = psVar3->suppressErr;
                psVar3->suppressErr = '\x01';
                local_a8 = pEVar10;
                local_68.pParse = pParse;
                local_68.uNC.pEList = local_90.pEList;
                iVar8 = sqlite3ResolveExprNames(&local_68,pEVar10);
                psVar3->suppressErr = uVar2;
                pEVar10 = local_a8;
                pParse = local_78;
                iVar7 = 0;
                if ((iVar8 == 0) && (iVar7 = 0, 0 < (local_90.pEList)->nExpr)) {
                  pEVar11 = (local_90.pEList)->a;
                  lVar12 = 0;
                  do {
                    uVar9 = sqlite3ExprCompare((Parse *)0x0,pEVar11->pExpr,local_a8,-1);
                    pEVar10 = local_a8;
                    pParse = local_78;
                    if (uVar9 < 2) {
                      iVar7 = (int)lVar12 + 1;
                      goto LAB_0016ddf0;
                    }
                    lVar12 = lVar12 + 1;
                    pEVar11 = pEVar11 + 1;
                  } while (lVar12 < (local_90.pEList)->nExpr);
                  iVar7 = 0;
                }
              }
LAB_0016ddf0:
              local_ac = iVar7;
              if (pEVar10 != (Expr *)0x0) {
                sqlite3ExprDeleteNN(local_a0,pEVar10);
              }
            }
            if (local_ac < 1) {
              local_94 = 1;
              pEVar16 = local_88;
              goto LAB_0016de8c;
            }
          }
          else if ((local_ac < 1) || (*(int *)&local_80->db < local_ac)) {
            sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)(iVar15 + 1),"ORDER");
            return 1;
          }
          iVar7 = local_ac;
          local_68.pParse = (Parse *)0x0;
          local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
          pEVar10 = sqlite3ExprAlloc(local_a0,0x8f,(Token *)&local_68,0);
          if (pEVar10 == (Expr *)0x0) {
            return 1;
          }
          pbVar1 = (byte *)((long)&pEVar10->flags + 1);
          *pbVar1 = *pbVar1 | 4;
          (pEVar10->u).iValue = iVar7;
          pEVar11 = pEVar18;
          pEVar4 = pEVar18->pExpr;
          if (pEVar18->pExpr != p) {
            do {
              pEVar13 = pEVar4;
              pEVar4 = pEVar13->pLeft;
            } while (pEVar4->op == 'f');
            pEVar11 = (ExprList_item *)&pEVar13->pLeft;
          }
          pEVar11->pExpr = pEVar10;
          if (p != (Expr *)0x0) {
            sqlite3ExprDeleteNN(local_a0,p);
            iVar7 = local_ac;
          }
          (pEVar18->u).x.iOrderByCol = (u16)iVar7;
          pEVar18->field_0x19 = pEVar18->field_0x19 | 1;
          pEVar16 = local_88;
        }
LAB_0016de8c:
        iVar15 = iVar15 + 1;
        pEVar18 = pEVar18 + 1;
        uVar9 = pEVar16->nExpr;
        uVar17 = (ulong)uVar9;
      } while (iVar15 < (int)uVar9);
      pSelect = pSelect->pNext;
    } while ((pSelect != (Select *)0x0) && (local_94 != 0));
    if ((int)uVar9 < 1) {
      return 0;
    }
    uVar14 = 1;
    lVar12 = 0;
    while (((&pEVar16->a[0].field_0x19)[lVar12] & 1) != 0) {
      uVar14 = (ulong)((int)uVar14 + 1);
      lVar12 = lVar12 + 0x20;
      if (uVar17 << 5 == lVar12) {
        return 0;
      }
    }
    sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",uVar14);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          Expr *pParent = pItem->pExpr;
          assert( pParent->op==TK_COLLATE );
          while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
          assert( pParent->pLeft==pE );
          pParent->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->u.x.iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}